

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O2

OPJ_BOOL opj_bio_flush(opj_bio_t *bio)

{
  OPJ_BOOL OVar1;
  OPJ_BOOL OVar2;
  
  OVar1 = opj_bio_byteout(bio);
  OVar2 = 0;
  if (OVar1 != 0) {
    if ((bio->ct == 7) && (OVar1 = opj_bio_byteout(bio), OVar1 == 0)) {
      return 0;
    }
    OVar2 = 1;
  }
  return OVar2;
}

Assistant:

OPJ_BOOL opj_bio_flush(opj_bio_t *bio)
{
    if (! opj_bio_byteout(bio)) {
        return OPJ_FALSE;
    }
    if (bio->ct == 7) {
        if (! opj_bio_byteout(bio)) {
            return OPJ_FALSE;
        }
    }
    return OPJ_TRUE;
}